

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# probe.c
# Opt level: O0

void markBonds(atom *src,atom *neighbors,int distcount,int max)

{
  int iVar1;
  char *pcVar2;
  bool bVar3;
  bool bVar4;
  double local_b8;
  double local_98;
  double local_78;
  double local_58;
  int letItBond;
  int isBanH;
  int isAanH;
  int tooclose;
  int nearpt;
  atom *theOtherAtom;
  atom *theHatom;
  atom *targ;
  int max_local;
  int distcount_local;
  atom *neighbors_local;
  atom *src_local;
  
  theHatom = neighbors;
  do {
    if (theHatom == (atom *)0x0) {
      return;
    }
    if ((theHatom->mark == 0) || (distcount < theHatom->mark)) {
      local_58 = 0.2;
      if (UseStdBond == 0) {
        local_58 = 0.0;
      }
      local_78 = 0.2;
      if (UseStdBond == 0) {
        local_78 = 0.0;
      }
      local_98 = 0.2;
      if (UseStdBond == 0) {
        local_98 = 0.0;
      }
      local_b8 = 0.2;
      if (UseStdBond == 0) {
        local_b8 = 0.0;
      }
      if ((((src->loc).z - (theHatom->loc).z) * ((src->loc).z - (theHatom->loc).z) +
           ((src->loc).x - (theHatom->loc).x) * ((src->loc).x - (theHatom->loc).x) +
           ((src->loc).y - (theHatom->loc).y) * ((src->loc).y - (theHatom->loc).y) <=
           ((double)(src->covRad + theHatom->covRad) + 0.2 + local_58) *
           ((double)(src->covRad + theHatom->covRad) + 0.2 + local_78)) &&
         ((((double)(src->covRad + theHatom->covRad) - 0.6) - local_98) *
          (((double)(src->covRad + theHatom->covRad) - 0.6) - local_b8) <
          ((src->loc).z - (theHatom->loc).z) * ((src->loc).z - (theHatom->loc).z) +
          ((src->loc).x - (theHatom->loc).x) * ((src->loc).x - (theHatom->loc).x) +
          ((src->loc).y - (theHatom->loc).y) * ((src->loc).y - (theHatom->loc).y))) {
        iVar1 = getAtno(src->elem);
        bVar3 = iVar1 == 1;
        iVar1 = getAtno(theHatom->elem);
        bVar4 = false;
        if ((bVar3) || (iVar1 == 1)) {
          if (((bVar3) && (iVar1 == 1)) ||
             ((src->r != theHatom->r &&
              (((((src->r->resid != theHatom->r->resid ||
                  (src->r->resInsCode != theHatom->r->resInsCode)) ||
                 (iVar1 = strcmp(src->r->chain,theHatom->r->chain), iVar1 != 0)) ||
                (src->r->model != theHatom->r->model)) ||
               ((SplitBySegID != 0 && (iVar1 = strcmp(src->r->segid,theHatom->r->segid), iVar1 != 0)
                ))))))) {
            bVar4 = false;
          }
          else {
            if (bVar3) {
              _tooclose = theHatom;
              theOtherAtom = src;
            }
            else {
              theOtherAtom = theHatom;
              _tooclose = src;
            }
            if (((theOtherAtom->bondedto == (char *)0x0) ||
                (pcVar2 = strstr(theOtherAtom->bondedto,_tooclose->atomname), pcVar2 != (char *)0x0)
                ) || (UseHParent == 0)) {
              bVar4 = true;
            }
          }
        }
        else if (UseStdBond == 0) {
          bVar4 = true;
        }
        else if ((src->r == theHatom->r) ||
                ((((src->r->resid == theHatom->r->resid &&
                   (src->r->resInsCode == theHatom->r->resInsCode)) &&
                  (iVar1 = strcmp(src->r->chain,theHatom->r->chain), iVar1 == 0)) &&
                 ((src->r->model == theHatom->r->model &&
                  ((SplitBySegID == 0 ||
                   (iVar1 = strcmp(src->r->segid,theHatom->r->segid), iVar1 == 0)))))))) {
          bVar4 = true;
          if (src->bondedto != (char *)0x0) {
            pcVar2 = strstr(src->bondedto,theHatom->atomname);
            bVar4 = pcVar2 != (char *)0x0;
          }
        }
        else if (((src->props & 1U) == 0) || ((theHatom->props & 1U) == 0)) {
          if (((src->props & 1U) == 0) && ((theHatom->props & 1U) == 0)) {
            iVar1 = strcmp(src->r->resname,"CYS");
            bVar4 = false;
            if (iVar1 == 0) {
              iVar1 = strcmp(src->atomname," SG ");
              bVar4 = false;
              if (iVar1 == 0) {
                iVar1 = strcmp(theHatom->r->resname,"CYS");
                bVar4 = false;
                if (iVar1 == 0) {
                  iVar1 = strcmp(theHatom->atomname," SG ");
                  bVar4 = iVar1 == 0;
                }
              }
            }
          }
        }
        else {
          iVar1 = strcmp(" N  ",src->atomname);
          if (iVar1 == 0) {
            iVar1 = strcmp(" C  ",theHatom->atomname);
            bVar4 = true;
            if (iVar1 == 0) goto LAB_0013ef31;
          }
          iVar1 = strcmp(" N  ",theHatom->atomname);
          if (iVar1 == 0) {
            iVar1 = strcmp(" C  ",src->atomname);
            bVar4 = true;
            if (iVar1 == 0) goto LAB_0013ef31;
          }
          iVar1 = strcmp(" P  ",src->atomname);
          if (iVar1 == 0) {
            pcVar2 = strstr(" O3*: O3\'",theHatom->atomname);
            bVar4 = true;
            if (pcVar2 != (char *)0x0) goto LAB_0013ef31;
          }
          iVar1 = strcmp(" P  ",theHatom->atomname);
          bVar4 = false;
          if (iVar1 == 0) {
            pcVar2 = strstr(" O3*: O3\'",src->atomname);
            bVar4 = pcVar2 != (char *)0x0;
          }
        }
LAB_0013ef31:
        if ((bVar4) && (theHatom->mark = distcount, distcount < max)) {
          markBonds(theHatom,neighbors,distcount + 1,max);
        }
      }
    }
    theHatom = theHatom->scratch;
  } while( true );
}

Assistant:

void markBonds(atom *src, atom *neighbors, int distcount, int max)
{/*markBonds  reformated 041112*/
   atom *targ = NULL, *theHatom = NULL, *theOtherAtom = NULL;
   int nearpt, tooclose, isAanH, isBanH, letItBond = FALSE;

   /*when making surface dots, max==1 */
   /*when looking for contacts and clashes, max==Maxbonded */

   for(targ = neighbors; targ; targ = targ->scratch)
   {/*for(loop over neighbors)*/

      /*first pass look at neighbors of external calling atom: targ->mark == 0*/
      /*later look at neighbors of neighbors: targ->mark > max */
      /* until Maxbonded neighbor when targ->mark == max */

      if (targ->mark == 0 || targ->mark > distcount)
      {/*if(targ->mark == 0 || targ->mark > distcount) */

	 /* note: when we are relying on the StdBond table   */
	 /*       to figure out which bonds are allowed      */
	 /*       we can be more generous with the distance  */
	 /*       cuttofs to permit more oddball distortions */
         /*dcr: so it seems that with UseStdBond 2*COVRADFUDGE is added */
         /*atomprops.h/defines COVRADFUDGE 0.2        050111 */

#ifdef INLINE_FOR_SPEED
	 nearpt = INRANGEINLINE((src->loc), (targ->loc),
		     src->covRad + targ->covRad + COVRADFUDGE
		     + (UseStdBond ? COVRADFUDGE : 0.0) );

	 tooclose = INRANGEINLINE((src->loc), (targ->loc),
			   src->covRad + targ->covRad - 0.6
			   - (UseStdBond ? COVRADFUDGE : 0.0) );
#else
	 nearpt = inRange(&(src->loc), &(targ->loc),
		     src->covRad + targ->covRad + COVRADFUDGE
		     + (UseStdBond ? COVRADFUDGE : 0.0) );

	 tooclose = inRange(&(src->loc), &(targ->loc),
			   src->covRad + targ->covRad - 0.6
			   - (UseStdBond ? COVRADFUDGE : 0.0) );
#endif
            /*returns true when distance-sq between a and b <= limit-sq */

/*050111 tooclose=   does NOT seem to be the call where */
/*atoms that move too close together suddenly stop showing bad clashes ! */
/*i.e. force tooclose = 0  here does not affect very close clash cut-off*/
/* and indeed atoms not bonded because of tooclose should show clashes !? */
/*but actual close distance of cut-off seems to be dependent on UseStdBond */
/*so since this is the only place where COVRADFUDGE is used, one suspects */
/*that this markBonds() is responsible for showing as bonded those atoms */
/*that fail to show clashes as they get near to each other*/
/*However, although this markBonds seems to check each atom pair many times, */
/*it does look as if it declares the letItBond flag correctly even when close!*/
/*050111 BUT this seems where all bonding info is calc, so maybe letItBond is */
/*not interpreted correctly by this analysis...*/
/*050117 specific case of ala_dipeptide at phi==0,psi==0, tau<= 102.25 seems */
/*the N of res 2 is just within bonding criteria of C of res 0 and with*/
/*UseStdBond N -- C  bonds are allowed between atoms of different residues*/
/*thus the covalent neighbors of that N and that C, e.g. NH of 2 and O of 0 */
/*are also considered to NOT clash! */
/*For autobondrot and mage/probe strict succession would cure this...*/
/*BUT one does need to allow for deletions in residue order!*/
/*SO this is a FEATURE, NOT a BUG */
/*and the work-around is to restrict the tau deviation to what is more */
/*reasonable for tau anyway of  -8, thus -5 to +10 around ideal 111.1 */
/*might be the best range for getting a feel for allowable phi,psi regions*/

	 /* conditions for allowing a bond to be formed... */

	 if (nearpt && (! tooclose) )
         {/*close enough for a bond*/
	    isAanH = isHatom(src->elem);
	    isBanH = isHatom(targ->elem);

#ifdef OLD_BONDING_CALC
	    if(  (   ! isAanH && ! isBanH ) /* neither atom is a hydrogen  */
	       ||(  (! isAanH || ! isBanH) /*or one is an H */
	          && ATOMS_IN_THE_SAME_RES(src, targ) /* and both are in same*/
                                                      /* res with parent name*/
	          &&(  (theHatom->bondedto == NULL) /*and either unknown */
                     or as expected*/
	             || strstr(theHatom->bondedto, theOtherAtom->atomname)
                                                                           ) ) )
            {
	       targ->mark = distcount;
	       if (distcount < max) {
		  markBonds(targ, neighbors, distcount+1, max);
	       }
	    }
#else /*NOT OLD_BONDING_CALC*/
	    letItBond = FALSE; /* we start out skeptical */
	    if ((! isAanH) && (! isBanH))
            {/* neither atom is a hydrogen - both are heavy atoms */

	       if (UseStdBond)
               {/* if we are allowing only "standard" bonding */

		  if (! ATOMS_IN_THE_SAME_RES(src, targ))
                  { /* and are in diff res */

		     if ((src->props & MC_PROP) && (targ->props & MC_PROP))
                     {/* both are mc in diff res - */
                        /*only specific bonding patterns allowed */

                        /*strcmp(a,b) returns 0 when strings == (a==b) */
                        /*strstr returns 1 when any str in colon delineated*/
                        /* list matches reference str */

			letItBond =
                           (    !strcmp(" N  ", src->atomname)
                             && !strcmp(" C  ",targ->atomname) )
                        || (    !strcmp(" N  ",targ->atomname)
                             && !strcmp(" C  ", src->atomname) )
			|| (    !strcmp(" P  ", src->atomname)
                             &&  strstr(" O3*: O3'", targ->atomname) )
			|| (    !strcmp(" P  ",targ->atomname)
                             &&  strstr(" O3*: O3'",  src->atomname) );
		     }
		     else if(   !(src->props & MC_PROP)
                             && !(targ->props & MC_PROP) )
                     {
			/* both are sc in diff res they must be CYS-CYS SS */
			letItBond = (   !strcmp(src->r->resname,  "CYS")
                                     && !strcmp(src->atomname,   " SG ")
				     && !strcmp(targ->r->resname, "CYS")
                                     && !strcmp(targ->atomname,  " SG ") );
		     }

                     /*050121 remove dcr041112 code insertion */
                        /*inserted test to allow mage/probe fitting of a*/
                        /*particular sidechain in context of an NMR ensemble*/
                     /*Lmodeltest not needed, mage sends model # when needed*/

                  }/* and are in diff res */
		  else
                  {/* both heavy atoms in same res */
                        /*strstr returns 1 when any str in colon delineated*/
                        /* list matches reference str */
#ifdef STRICT_CONN_TABLE /*050111 seems to be not defined*/
		     /* strict - heavy atom must be as exactly expected */
		     letItBond = (   (src->bondedto != NULL)
                                  && strstr(src->bondedto, targ->atomname) );
#else /*NOT STRICT_CONN_TABLE*/
		     /* heavy atom either unknown or as expected */
		     letItBond = (   (src->bondedto == NULL)
                                  || strstr(src->bondedto, targ->atomname) );
#endif /*def? STRICT_CONN_TABLE*/
		  }
               }/* if we are allowing only "standard" bonding */
	       else
               {/* not using std bond table - */
                  /*so we let heavy atoms bond when they are close enough */
		  letItBond = TRUE;
	       }
            }/* neither atom is a hydrogen - both are heavy atoms */
	    else if(   (! isAanH || ! isBanH) /* only one atom is a hydrogen */
	            && ATOMS_IN_THE_SAME_RES(src, targ) ) /* and both atoms*/
                                                       /* are in the same res*/
            {
	       if (isAanH) { theHatom = src;  theOtherAtom = targ; }
	       else        { theHatom = targ; theOtherAtom = src;  }

	       if(  (theHatom->bondedto == NULL) /* heavy atom either unknown*/
                                                 /*  or as expected */
	          || strstr(theHatom->bondedto, theOtherAtom->atomname)
	          || (UseHParent == FALSE) )
               {
		  letItBond = TRUE;
	       }
	    }
	    else
            {/*either both are hydrogens in the same residue- no bond possible*/
	       /*  or one is a H and they are in diff res - no bond possible */
	       letItBond = FALSE;
	    }

	    if (letItBond) /*check connectivity through Maxbonded neighbors*/
            {
	       targ->mark = distcount; /*initially == 1 as called externally*/
	       if (distcount < max)  /*max == Maxbonded  as input or defaulted*/
               {/*reentrant: no clashes between atoms within Maxbonded bonds*/
		  markBonds(targ, neighbors, distcount+1, max);
	       }
               /*else targ->mark == max > discount and loop will end*/
#ifdef DUMP_DEBUG_EXTRA
	       if (DebugLevel > 7)
               {
		  fprintf(stdout, "{%4.4s%c%3.3s%s%4.4s%c}P %8.3f%8.3f%8.3f\n",
			   src->atomname, src->altConf,
			   src->r->resname, src->r->chain,
			   src->r->Hy36resno, src->r->resInsCode,
			   src->loc.x, src->loc.y, src->loc.z);
		  fprintf(stdout, "{%4.4s%c%3.3s%s%4.4s%c}L %8.3f%8.3f%8.3f\n",
			   targ->atomname, targ->altConf,
			   targ->r->resname, targ->r->chain,
			   targ->r->Hy36resno, targ->r->resInsCode,
			   targ->loc.x, targ->loc.y, targ->loc.z);
	       }
#endif /*DUMP_DEBUG_EXTRA*/
	    }
#endif /*def? OLD_BONDING_CALC not defined as of 050111*/
         }/*close enough for a bond*/
      }/*if(targ->mark == 0 || targ->mark > distcount) */

   }/*for(loop over neighbors)*/
}